

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ma_uint32 mVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) {
    return 0;
  }
  if (((pWav->translatedFormatTag != 2) && (pWav->translatedFormatTag != 0x11)) &&
     (mVar1 = ma_dr_wav_get_bytes_per_pcm_frame(pWav), mVar1 != 0)) {
    uVar2 = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
    if (framesToRead <= uVar2) {
      uVar2 = framesToRead;
    }
    sVar3 = uVar2 * mVar1;
    if (sVar3 != 0) {
      sVar3 = ma_dr_wav_read_raw(pWav,sVar3,pBufferOut);
      return sVar3 / mVar1;
    }
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint32 bytesPerFrame;
    ma_uint64 bytesToRead;
    ma_uint64 framesRemainingInFile;
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }
    framesRemainingInFile = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
    if (framesToRead > framesRemainingInFile) {
        framesToRead = framesRemainingInFile;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > MA_SIZE_MAX) {
        bytesToRead = (MA_SIZE_MAX / bytesPerFrame) * bytesPerFrame;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    return ma_dr_wav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}